

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashMap.hpp
# Opt level: O0

void __thiscall HashMap<Socket_*,_unsigned_int>::clear(HashMap<Socket_*,_unsigned_int> *this)

{
  Item *end;
  Item *i;
  HashMap<Socket_*,_unsigned_int> *this_local;
  
  for (end = (this->_begin).item; end != &this->endItem; end = end->next) {
    *end->cell = (Item *)0x0;
    end->prev = this->freeItem;
    this->freeItem = end;
  }
  (this->_begin).item = &this->endItem;
  (this->endItem).prev = (Item *)0x0;
  this->_size = 0;
  return;
}

Assistant:

void clear()
  {
    for(Item* i = _begin.item, * end = &endItem; i != end; i = i->next)
    {
      i->~Item();
      *i->cell = 0;
      i->prev = freeItem;
      freeItem = i;
    }
    _begin.item = &endItem;
    endItem.prev = 0;
    _size = 0;
  }